

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

FunctionLookupChain *
anon_unknown.dwarf_6f1cc::LookupFunctionChainByName
          (FunctionLookupChain *__return_storage_ptr__,ExpressionContext *ctx,uint nameHash)

{
  bool_type bVar1;
  undefined1 local_30 [8];
  Node curr;
  ScopeData *scope;
  uint nameHash_local;
  ExpressionContext *ctx_local;
  
  curr.node = (Node *)ctx->scope;
  while( true ) {
    if (curr.node == (Node *)0x0) {
      FunctionLookupChain::FunctionLookupChain(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    _local_30 = DirectChainedMap<IdentifierLookupResult>::first
                          ((DirectChainedMap<IdentifierLookupResult> *)(curr.node + 0x120),nameHash)
    ;
    bVar1 = DirectChainedMap::NodeIterator::operator_cast_to_function_pointer
                      ((NodeIterator *)local_30);
    if (bVar1 != 0) break;
    curr.node = *(Node **)curr.node;
  }
  if (*(long *)(curr.start + 0x10) != 0) {
    FunctionLookupChain::FunctionLookupChain
              (__return_storage_ptr__,_local_30,(ScopeData *)curr.node);
    return __return_storage_ptr__;
  }
  FunctionLookupChain::FunctionLookupChain(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

FunctionLookupChain LookupFunctionChainByName(ExpressionContext &ctx, unsigned nameHash)
	{
		typedef DirectChainedMap<IdentifierLookupResult>::NodeIterator Node;

		ScopeData *scope = ctx.scope;

		while(scope)
		{
			if(Node curr = scope->idLookupMap.first(nameHash))
			{
				if(curr.node->value.function)
					return FunctionLookupChain(curr, scope);

				return FunctionLookupChain();
			}

			scope = scope->scope;
		}

		return FunctionLookupChain();
	}